

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O1

void __thiscall choc::value::Value::addMember<double>(Value *this,string_view name,double v)

{
  undefined8 __ptr;
  Allocator *pAVar1;
  Type local_38;
  double local_18;
  
  local_38.mainType = float64;
  local_38.content.object = (Object *)0x0;
  local_38.allocator = (Allocator *)0x0;
  local_18 = v;
  appendMember(this,name,&local_38,&local_18,8);
  pAVar1 = local_38.allocator;
  __ptr = local_38.content.object;
  if ((char)local_38.mainType < '\0') {
    if (local_38.mainType == object) {
      if (local_38.content.object == (Object *)0x0) {
        return;
      }
      Type::Object::~Object(local_38.content.object);
    }
    else {
      if (local_38.mainType != complexArray) {
        return;
      }
      if (local_38.content.object == (Object *)0x0) {
        return;
      }
      Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::~AllocatedVector
                ((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                 local_38.content.object);
    }
    if (pAVar1 == (Allocator *)0x0) {
      free((void *)__ptr);
    }
    else {
      (**(code **)(*(long *)pAVar1 + 0x20))(pAVar1,__ptr);
    }
  }
  return;
}

Assistant:

void Value::addMember (std::string_view name, MemberType v, Others&&... others)
{
    static_assert ((sizeof...(others) & 1) == 0, "The arguments must be a sequence of name, value pairs");

    static_assert (isPrimitiveType<MemberType>() || isStringType<MemberType>() || isValueType<MemberType>(),
                   "The template type needs to be one of the supported primitive types");

    if constexpr (isValueType<MemberType>())
    {
        value.type.addObjectMember (name, v.getType());
        appendValue (v);
    }
    else if constexpr (isStringType<MemberType>())
    {
        auto stringHandle = dictionary.getHandleForString (v);
        appendMember (name, Type::createString(), std::addressof (stringHandle.handle), sizeof (stringHandle.handle));
    }
    else if constexpr (matchesType<MemberType, int32_t>())   { appendMember (name, Type::createInt32(),   std::addressof (v), sizeof (v)); }
    else if constexpr (matchesType<MemberType, int64_t>())   { appendMember (name, Type::createInt64(),   std::addressof (v), sizeof (v)); }
    else if constexpr (matchesType<MemberType, float>())     { appendMember (name, Type::createFloat32(), std::addressof (v), sizeof (v)); }
    else if constexpr (matchesType<MemberType, double>())    { appendMember (name, Type::createFloat64(), std::addressof (v), sizeof (v)); }
    else if constexpr (matchesType<MemberType, bool>())      { uint8_t b = v ? 1 : 0; appendMember (name, Type::createBool(), std::addressof (b), sizeof (b)); }

    if constexpr (sizeof...(others) != 0)
        addMember (std::forward<Others> (others)...);
}